

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConnection.cxx
# Opt level: O2

void __thiscall cmEventBasedConnection::ReadData(cmEventBasedConnection *this,string *data)

{
  string *psVar1;
  cmConnectionBufferStrategy *pcVar2;
  string packet;
  string local_60 [8];
  long local_58;
  string local_40 [32];
  
  psVar1 = &this->RawReadBuffer;
  std::__cxx11::string::append((string *)psVar1);
  pcVar2 = (this->BufferStrategy)._M_t.
           super___uniq_ptr_impl<cmConnectionBufferStrategy,_std::default_delete<cmConnectionBufferStrategy>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmConnectionBufferStrategy_*,_std::default_delete<cmConnectionBufferStrategy>_>
           .super__Head_base<0UL,_cmConnectionBufferStrategy_*,_false>._M_head_impl;
  if (pcVar2 == (cmConnectionBufferStrategy *)0x0) {
    (*(this->super_cmConnection)._vptr_cmConnection[6])(this,psVar1);
    (this->RawReadBuffer)._M_string_length = 0;
    *(this->RawReadBuffer)._M_dataplus._M_p = '\0';
  }
  else {
    (*pcVar2->_vptr_cmConnectionBufferStrategy[2])(local_60,pcVar2,psVar1);
    while (local_58 != 0) {
      (*(this->super_cmConnection)._vptr_cmConnection[6])(this,local_60);
      pcVar2 = (this->BufferStrategy)._M_t.
               super___uniq_ptr_impl<cmConnectionBufferStrategy,_std::default_delete<cmConnectionBufferStrategy>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmConnectionBufferStrategy_*,_std::default_delete<cmConnectionBufferStrategy>_>
               .super__Head_base<0UL,_cmConnectionBufferStrategy_*,_false>._M_head_impl;
      (*pcVar2->_vptr_cmConnectionBufferStrategy[2])(local_40,pcVar2,psVar1);
      std::__cxx11::string::operator=(local_60,local_40);
      std::__cxx11::string::~string(local_40);
    }
    std::__cxx11::string::~string(local_60);
  }
  return;
}

Assistant:

void cmEventBasedConnection::ReadData(const std::string& data)
{
  this->RawReadBuffer += data;
  if (BufferStrategy) {
    std::string packet = BufferStrategy->BufferMessage(this->RawReadBuffer);
    while (!packet.empty()) {
      ProcessRequest(packet);
      packet = BufferStrategy->BufferMessage(this->RawReadBuffer);
    }
  } else {
    ProcessRequest(this->RawReadBuffer);
    this->RawReadBuffer.clear();
  }
}